

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O1

aiVector3D __thiscall comparer_context::cmp<aiVector3t<float>>(comparer_context *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  aiVector3D aVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_70;
  float local_4c;
  float local_48;
  float local_38;
  
  paVar1 = &local_70.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  local_38 = cmp<float>(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  local_48 = cmp<float>(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  local_4c = cmp<float>(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  aVar3.y = local_48;
  aVar3.x = local_38;
  aVar3.z = local_4c;
  return aVar3;
}

Assistant:

aiVector3D comparer_context :: cmp<aiVector3D >(const std::string& name)
{
    const float x = cmp<float>(name+".x");
    const float y = cmp<float>(name+".y");
    const float z = cmp<float>(name+".z");

    return aiVector3D(x,y,z);
}